

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O0

void PoolAllocPages(MemoryPool *pool,size_t number)

{
  void *pvVar1;
  Page *pacVar2;
  lldiv_t lVar3;
  long local_68;
  lldiv_t d;
  size_t i;
  size_t nbPages;
  size_t nbSysPages;
  size_t nbPagesPerSysPage;
  Page *prev;
  Page *page;
  Page *base;
  ThreadData *data;
  size_t number_local;
  MemoryPool *pool_local;
  
  pvVar1 = pthread_getspecific(tsdKey);
  i = systemPageSize >> 0xc;
  if (number == 1) {
    nbPages = 1;
  }
  else {
    lVar3 = lldiv(number,i);
    local_68 = lVar3.quot;
    d.quot = lVar3.rem;
    nbPages = local_68 + (int)(uint)(d.quot != 0);
    if (nbPages < 0x80) {
      i = (nbPages * i - number) + 1;
    }
    else {
      i = 1;
    }
  }
  pacVar2 = (Page *)SysPageAlloc(nbPages,(uint)(1 < pool->generation));
  if (pool->pages == (Page *)0x0) {
    pool->pages = pacVar2;
    for (d.rem = 0; (ulong)d.rem < 0x7f; d.rem = d.rem + 1) {
      pool->lastFreeCell[d.rem] = (Cell *)pacVar2;
    }
  }
  pool->nbPages = i + pool->nbPages;
  pool->nbAlloc = i + pool->nbAlloc;
  pool->nbSetCells = i + pool->nbSetCells;
  nbPagesPerSysPage = (size_t)pool->lastPage;
  prev = pacVar2;
  for (d.rem = 0; (ulong)d.rem < i; d.rem = d.rem + 1) {
    if (nbPagesPerSysPage != 0) {
      *(ulong *)nbPagesPerSysPage = *(ulong *)nbPagesPerSysPage & 0xff;
      *(ulong *)nbPagesPerSysPage = (ulong)prev & 0xffffffffffffff00 | *(ulong *)nbPagesPerSysPage;
    }
    nbPagesPerSysPage = (size_t)prev;
    *(ulong *)*prev = *(ulong *)*prev & 0xfffffffffffffff0;
    *(ulong *)*prev = (ulong)(pool->generation & 0xf) | *(ulong *)*prev;
    *(ulong *)*prev = *(ulong *)*prev & 0xffffffffffffff0f;
    *(undefined8 *)(*prev + 8) = *(undefined8 *)((long)pvVar1 + 8);
    ClearAllCells(prev);
    prev = prev + 1;
  }
  pool->lastPage = (Page *)nbPagesPerSysPage;
  *(ulong *)*pacVar2 = *(ulong *)*pacVar2 | 0x10;
  *(ulong *)nbPagesPerSysPage = *(ulong *)nbPagesPerSysPage & 0xff;
  *(undefined8 *)nbPagesPerSysPage = *(undefined8 *)nbPagesPerSysPage;
  *(ulong *)nbPagesPerSysPage = *(ulong *)nbPagesPerSysPage | 0x20;
  return;
}

Assistant:

void
PoolAllocPages(
    MemoryPool *pool,   /*!< Pool to allocate pages into. */
    size_t number)      /*!< Number of pages to allocate. */
{
    ThreadData *data = PlatGetThreadData();
    Page *base, *page, *prev;
    const size_t nbPagesPerSysPage = systemPageSize/PAGE_SIZE;
    size_t nbSysPages, nbPages;
    size_t i;

    if (number == 1) {
        /*
         * Regular case: allocate one physical page divided into equally sized
         * logical pages.
         */

        nbSysPages = 1;
        nbPages = nbPagesPerSysPage;
    } else {
        /*
         * Allocate enough physical pages for the given number of logical pages.
         */

        lldiv_t d = lldiv(number, nbPagesPerSysPage);
        nbSysPages = d.quot + (d.rem?1:0);
        if (nbSysPages >= LARGE_PAGE_SIZE) {
            /*
             * Pages are in their own dedicated range.
             */

            nbPages = 1;
        } else {
            nbPages = (nbSysPages * nbPagesPerSysPage) - number + 1;
        }
    }

    /*
     * Allocate system pages. Make sure to mark pages as written for older
     * generations for proper parent tracking.
     */

    base = (Page *) SysPageAlloc(nbSysPages, (pool->generation >= 2));

    if (!pool->pages) {
        pool->pages = base;
        for (i = 0; i < AVAILABLE_CELLS; i++) {
            pool->lastFreeCell[i] = PAGE_CELL(base, 0);
        }
    }

    pool->nbPages += nbPages;
    pool->nbAlloc += nbPages;
    pool->nbSetCells += RESERVED_CELLS*nbPages;

    /*
     * Initialize pages.
     */

    prev = pool->lastPage;
    for (i = 0, page = base; i < nbPages; i++, page++) {
        /*
         * Pages are linked in order.
         */

        if (prev) {
            PAGE_SET_NEXT(prev, page);
        }
        prev = page;

        PAGE_SET_GENERATION(page, pool->generation);
        PAGE_CLEAR_FLAG(page, PAGE_FLAGS_MASK);
        PAGE_GROUPDATA(page) = data->groupData;

        /* Initialize bit mask for allocated cells. */
        ClearAllCells(page);
    }
    pool->lastPage = prev;
    PAGE_SET_FLAG(base, PAGE_FLAG_FIRST);
    PAGE_SET_NEXT(prev, NULL);
    PAGE_SET_FLAG(prev, PAGE_FLAG_LAST);
}